

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmJoin<cmList>(string *__return_storage_ptr__,cmList *rng,string_view separator)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  pointer pbVar4;
  ostringstream os;
  undefined1 auStack_1a8 [376];
  
  if ((rng->Values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (rng->Values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
    pbVar1 = (rng->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (rng->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    while (pbVar4 = pbVar1 + 1, pbVar4 != pbVar2) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)auStack_1a8,separator._M_str,separator._M_len);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(pbVar4->_M_dataplus)._M_p,pbVar1[1]._M_string_length);
      pbVar1 = pbVar4;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
    std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}